

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestJson.cpp
# Opt level: O2

void testJson(void)

{
  Data *pDVar1;
  Data *pDVar2;
  Data *pDVar3;
  code *pcVar4;
  bool bVar5;
  int iVar6;
  HashMap<String,_Variant> *pHVar7;
  Iterator IVar8;
  String *pSVar9;
  List<Variant> *pLVar10;
  String local_120;
  String local_f8;
  String local_d0;
  Variant data;
  Parser parser;
  String surrogatePairCheck;
  String input;
  
  Json::Parser::Parser(&parser);
  data.data = &Variant::nullData.super_Data;
  input.data = &input._data;
  input._data.ref = 0;
  input._data.str =
       "{\n  \"title\": \"Example Schema\",\n  \"surrogatePair\": \"aa\\uD834\\uDD1Ebb\",\n  \"type\": \"object\",\n  \"properties\": {\n    \"firstName\": {\n      \"type\": \"string\"\n    },\n    \"lastName\": {\n      \"type\": \"string\"\n    },\n    \"age\": {\n      \"description\": \"Age in years\",\n      \"type\": \"integer\",\n      \"minimum\": 0\n    }\n  },\n  \"required\": [\"firstName\", \"lastName\"]\n}\n"
  ;
  input._data.len = 0x160;
  bVar5 = Json::Parser::parse(&parser,&input,&data);
  if (!bVar5) {
    iVar6 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestJson.cpp"
                          ,0x1d,"parser.parse(input, data)");
    if (iVar6 != 0) goto LAB_00103090;
  }
  pHVar7 = Variant::toMap(&data);
  surrogatePairCheck.data = &surrogatePairCheck._data;
  surrogatePairCheck._data.ref = 0;
  surrogatePairCheck._data.str = "title";
  surrogatePairCheck._data.len = 5;
  IVar8 = HashMap<String,_Variant>::find(pHVar7,&surrogatePairCheck);
  pSVar9 = Variant::toString(&(IVar8.item)->value);
  bVar5 = String::operator==(pSVar9,(char (*) [15])"Example Schema");
  if (!bVar5) {
    iVar6 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestJson.cpp"
                          ,0x1e,"data.toMap().find(\"title\")->toString() == \"Example Schema\"");
    if (iVar6 != 0) goto LAB_00103090;
  }
  String::~String(&surrogatePairCheck);
  surrogatePairCheck.data = &String::emptyData.super_Data;
  pDVar1 = &local_120._data;
  local_120._data.ref = 0;
  local_120._data.str = "aa";
  local_120._data.len = 2;
  local_120.data = pDVar1;
  String::append(&surrogatePairCheck,&local_120);
  String::~String(&local_120);
  Unicode::append(0x1d11e,&surrogatePairCheck);
  local_120._data.ref = 0;
  local_120._data.str = "bb";
  local_120._data.len = 2;
  local_120.data = pDVar1;
  String::append(&surrogatePairCheck,&local_120);
  String::~String(&local_120);
  pHVar7 = Variant::toMap(&data);
  local_120._data.ref = 0;
  local_120._data.str = "surrogatePair";
  local_120._data.len = 0xd;
  local_120.data = pDVar1;
  IVar8 = HashMap<String,_Variant>::find(pHVar7,&local_120);
  pSVar9 = Variant::toString(&(IVar8.item)->value);
  bVar5 = String::operator==(pSVar9,&surrogatePairCheck);
  if (!bVar5) {
    iVar6 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestJson.cpp"
                          ,0x23,
                          "data.toMap().find(\"surrogatePair\")->toString() == surrogatePairCheck");
    if (iVar6 != 0) goto LAB_00103090;
  }
  String::~String(&local_120);
  pHVar7 = Variant::toMap(&data);
  local_120._data.ref = 0;
  local_120._data.str = "type";
  local_120._data.len = 4;
  local_120.data = pDVar1;
  IVar8 = HashMap<String,_Variant>::find(pHVar7,&local_120);
  pSVar9 = Variant::toString(&(IVar8.item)->value);
  bVar5 = String::operator==(pSVar9,(char (*) [7])"object");
  if (!bVar5) {
    iVar6 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestJson.cpp"
                          ,0x24,"data.toMap().find(\"type\")->toString() == \"object\"");
    if (iVar6 != 0) goto LAB_00103090;
  }
  String::~String(&local_120);
  pHVar7 = Variant::toMap(&data);
  local_120._data.ref = 0;
  local_120._data.str = "properties";
  local_120._data.len = 10;
  local_120.data = pDVar1;
  IVar8 = HashMap<String,_Variant>::find(pHVar7,&local_120);
  pHVar7 = Variant::toMap(&(IVar8.item)->value);
  pDVar2 = &local_d0._data;
  local_d0._data.ref = 0;
  local_d0._data.str = "firstName";
  local_d0._data.len = 9;
  local_d0.data = pDVar2;
  IVar8 = HashMap<String,_Variant>::find(pHVar7,&local_d0);
  pHVar7 = Variant::toMap(&(IVar8.item)->value);
  pDVar3 = &local_f8._data;
  local_f8._data.ref = 0;
  local_f8._data.str = "type";
  local_f8._data.len = 4;
  local_f8.data = pDVar3;
  IVar8 = HashMap<String,_Variant>::find(pHVar7,&local_f8);
  pSVar9 = Variant::toString(&(IVar8.item)->value);
  bVar5 = String::operator==(pSVar9,(char (*) [7])"string");
  if (!bVar5) {
    iVar6 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestJson.cpp"
                          ,0x25,
                          "data.toMap().find(\"properties\")->toMap().find(\"firstName\")->toMap().find(\"type\")->toString() == \"string\""
                         );
    if (iVar6 != 0) goto LAB_00103090;
  }
  String::~String(&local_f8);
  String::~String(&local_d0);
  String::~String(&local_120);
  pHVar7 = Variant::toMap(&data);
  local_120._data.ref = 0;
  local_120._data.str = "properties";
  local_120._data.len = 10;
  local_120.data = pDVar1;
  IVar8 = HashMap<String,_Variant>::find(pHVar7,&local_120);
  pHVar7 = Variant::toMap(&(IVar8.item)->value);
  local_d0._data.ref = 0;
  local_d0._data.str = "lastName";
  local_d0._data.len = 8;
  local_d0.data = pDVar2;
  IVar8 = HashMap<String,_Variant>::find(pHVar7,&local_d0);
  pHVar7 = Variant::toMap(&(IVar8.item)->value);
  local_f8._data.ref = 0;
  local_f8._data.str = "type";
  local_f8._data.len = 4;
  local_f8.data = pDVar3;
  IVar8 = HashMap<String,_Variant>::find(pHVar7,&local_f8);
  pSVar9 = Variant::toString(&(IVar8.item)->value);
  bVar5 = String::operator==(pSVar9,(char (*) [7])"string");
  if (!bVar5) {
    iVar6 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestJson.cpp"
                          ,0x26,
                          "data.toMap().find(\"properties\")->toMap().find(\"lastName\")->toMap().find(\"type\")->toString() == \"string\""
                         );
    if (iVar6 != 0) goto LAB_00103090;
  }
  String::~String(&local_f8);
  String::~String(&local_d0);
  String::~String(&local_120);
  pHVar7 = Variant::toMap(&data);
  local_120._data.ref = 0;
  local_120._data.str = "properties";
  local_120._data.len = 10;
  local_120.data = pDVar1;
  IVar8 = HashMap<String,_Variant>::find(pHVar7,&local_120);
  pHVar7 = Variant::toMap(&(IVar8.item)->value);
  local_d0._data.ref = 0;
  local_d0._data.str = "age";
  local_d0._data.len = 3;
  local_d0.data = pDVar2;
  IVar8 = HashMap<String,_Variant>::find(pHVar7,&local_d0);
  pHVar7 = Variant::toMap(&(IVar8.item)->value);
  local_f8._data.ref = 0;
  local_f8._data.str = "description";
  local_f8._data.len = 0xb;
  local_f8.data = pDVar3;
  IVar8 = HashMap<String,_Variant>::find(pHVar7,&local_f8);
  pSVar9 = Variant::toString(&(IVar8.item)->value);
  bVar5 = String::operator==(pSVar9,(char (*) [13])"Age in years");
  if (!bVar5) {
    iVar6 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestJson.cpp"
                          ,0x27,
                          "data.toMap().find(\"properties\")->toMap().find(\"age\")->toMap().find(\"description\")->toString() == \"Age in years\""
                         );
    if (iVar6 != 0) goto LAB_00103090;
  }
  String::~String(&local_f8);
  String::~String(&local_d0);
  String::~String(&local_120);
  pHVar7 = Variant::toMap(&data);
  local_120._data.ref = 0;
  local_120._data.str = "properties";
  local_120._data.len = 10;
  local_120.data = pDVar1;
  IVar8 = HashMap<String,_Variant>::find(pHVar7,&local_120);
  pHVar7 = Variant::toMap(&(IVar8.item)->value);
  local_d0._data.ref = 0;
  local_d0._data.str = "age";
  local_d0._data.len = 3;
  local_d0.data = pDVar2;
  IVar8 = HashMap<String,_Variant>::find(pHVar7,&local_d0);
  pHVar7 = Variant::toMap(&(IVar8.item)->value);
  local_f8._data.ref = 0;
  local_f8._data.str = "type";
  local_f8._data.len = 4;
  local_f8.data = pDVar3;
  IVar8 = HashMap<String,_Variant>::find(pHVar7,&local_f8);
  pSVar9 = Variant::toString(&(IVar8.item)->value);
  bVar5 = String::operator==(pSVar9,(char (*) [8])"integer");
  if (!bVar5) {
    iVar6 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestJson.cpp"
                          ,0x28,
                          "data.toMap().find(\"properties\")->toMap().find(\"age\")->toMap().find(\"type\")->toString() == \"integer\""
                         );
    if (iVar6 != 0) goto LAB_00103090;
  }
  String::~String(&local_f8);
  String::~String(&local_d0);
  String::~String(&local_120);
  pHVar7 = Variant::toMap(&data);
  local_120._data.ref = 0;
  local_120._data.str = "properties";
  local_120._data.len = 10;
  local_120.data = pDVar1;
  IVar8 = HashMap<String,_Variant>::find(pHVar7,&local_120);
  pHVar7 = Variant::toMap(&(IVar8.item)->value);
  local_d0._data.ref = 0;
  local_d0._data.str = "age";
  local_d0._data.len = 3;
  local_d0.data = pDVar2;
  IVar8 = HashMap<String,_Variant>::find(pHVar7,&local_d0);
  pHVar7 = Variant::toMap(&(IVar8.item)->value);
  local_f8._data.ref = 0;
  local_f8._data.str = "minimum";
  local_f8._data.len = 7;
  local_f8.data = pDVar3;
  IVar8 = HashMap<String,_Variant>::find(pHVar7,&local_f8);
  if ((((IVar8.item)->value).data)->type != intType) {
    iVar6 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestJson.cpp"
                          ,0x29,
                          "data.toMap().find(\"properties\")->toMap().find(\"age\")->toMap().find(\"minimum\")->getType() == Variant::intType"
                         );
    if (iVar6 != 0) goto LAB_00103090;
  }
  String::~String(&local_f8);
  String::~String(&local_d0);
  String::~String(&local_120);
  pHVar7 = Variant::toMap(&data);
  local_120._data.ref = 0;
  local_120._data.str = "properties";
  local_120._data.len = 10;
  local_120.data = pDVar1;
  IVar8 = HashMap<String,_Variant>::find(pHVar7,&local_120);
  pHVar7 = Variant::toMap(&(IVar8.item)->value);
  local_d0._data.ref = 0;
  local_d0._data.str = "age";
  local_d0._data.len = 3;
  local_d0.data = pDVar2;
  IVar8 = HashMap<String,_Variant>::find(pHVar7,&local_d0);
  pHVar7 = Variant::toMap(&(IVar8.item)->value);
  local_f8._data.ref = 0;
  local_f8._data.str = "minimum";
  local_f8._data.len = 7;
  local_f8.data = pDVar3;
  IVar8 = HashMap<String,_Variant>::find(pHVar7,&local_f8);
  iVar6 = Variant::toInt(&(IVar8.item)->value);
  if (iVar6 != 0) {
    iVar6 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestJson.cpp"
                          ,0x2a,
                          "data.toMap().find(\"properties\")->toMap().find(\"age\")->toMap().find(\"minimum\")->toInt() == 0"
                         );
    if (iVar6 != 0) goto LAB_00103090;
  }
  String::~String(&local_f8);
  String::~String(&local_d0);
  String::~String(&local_120);
  pHVar7 = Variant::toMap(&data);
  local_120._data.ref = 0;
  local_120._data.str = "required";
  local_120._data.len = 8;
  local_120.data = pDVar1;
  IVar8 = HashMap<String,_Variant>::find(pHVar7,&local_120);
  pLVar10 = Variant::toList(&(IVar8.item)->value);
  pSVar9 = Variant::toString(&((pLVar10->_begin).item)->value);
  bVar5 = String::operator==(pSVar9,(char (*) [10])"firstName");
  if (!bVar5) {
    iVar6 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestJson.cpp"
                          ,0x2b,
                          "data.toMap().find(\"required\")->toList().front().toString() == \"firstName\""
                         );
    if (iVar6 != 0) goto LAB_00103090;
  }
  String::~String(&local_120);
  pHVar7 = Variant::toMap(&data);
  local_120._data.ref = 0;
  local_120._data.str = "required";
  local_120._data.len = 8;
  local_120.data = pDVar1;
  IVar8 = HashMap<String,_Variant>::find(pHVar7,&local_120);
  pLVar10 = Variant::toList(&(IVar8.item)->value);
  pSVar9 = Variant::toString(&((pLVar10->_end).item)->prev->value);
  bVar5 = String::operator==(pSVar9,(char (*) [9])"lastName");
  if (!bVar5) {
    iVar6 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestJson.cpp"
                          ,0x2c,
                          "data.toMap().find(\"required\")->toList().back().toString() == \"lastName\""
                         );
    if (iVar6 != 0) {
LAB_00103090:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
  }
  String::~String(&local_120);
  String::~String(&surrogatePairCheck);
  String::~String(&input);
  Variant::clear(&data);
  Json::Parser::~Parser(&parser);
  return;
}

Assistant:

void testJson()
{
  Json::Parser parser;
  Variant data;
  String input("{\n"
"  \"title\": \"Example Schema\",\n"
"  \"surrogatePair\": \"aa\\uD834\\uDD1Ebb\",\n"
"  \"type\": \"object\",\n"
"  \"properties\": {\n"
"    \"firstName\": {\n"
"      \"type\": \"string\"\n"
"    },\n"
"    \"lastName\": {\n"
"      \"type\": \"string\"\n"
"    },\n"
"    \"age\": {\n"
"      \"description\": \"Age in years\",\n"
"      \"type\": \"integer\",\n"
"      \"minimum\": 0\n"
"    }\n"
"  },\n"
"  \"required\": [\"firstName\", \"lastName\"]\n"
"}\n");
  ASSERT(parser.parse(input, data));
  ASSERT(data.toMap().find("title")->toString() == "Example Schema");
  String surrogatePairCheck;
  surrogatePairCheck.append("aa");
  Unicode::append(0x1d11e, surrogatePairCheck);
  surrogatePairCheck.append("bb");
  ASSERT(data.toMap().find("surrogatePair")->toString() == surrogatePairCheck);
  ASSERT(data.toMap().find("type")->toString() ==  "object");
  ASSERT(data.toMap().find("properties")->toMap().find("firstName")->toMap().find("type")->toString() == "string");
  ASSERT(data.toMap().find("properties")->toMap().find("lastName")->toMap().find("type")->toString() == "string");
  ASSERT(data.toMap().find("properties")->toMap().find("age")->toMap().find("description")->toString() == "Age in years");
  ASSERT(data.toMap().find("properties")->toMap().find("age")->toMap().find("type")->toString() == "integer");
  ASSERT(data.toMap().find("properties")->toMap().find("age")->toMap().find("minimum")->getType() == Variant::intType);
  ASSERT(data.toMap().find("properties")->toMap().find("age")->toMap().find("minimum")->toInt() == 0);
  ASSERT(data.toMap().find("required")->toList().front().toString() == "firstName");
  ASSERT(data.toMap().find("required")->toList().back().toString() == "lastName");
}